

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int tinyexr::ParseEXRHeader
              (HeaderInfo *info,bool *empty_header,EXRVersion *version,string *err,uchar *buf)

{
  pointer *pp_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte bVar3;
  pointer p_Var4;
  undefined8 uVar5;
  int iVar6;
  uchar *puVar7;
  undefined8 uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong extraout_RDX;
  float *pfVar11;
  char cVar12;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attr_type;
  string attr_name;
  EXRAttribute attrib;
  int local_2dc;
  undefined1 local_2d8 [16];
  pointer local_2c8;
  string *local_2b8;
  EXRVersion *local_2b0;
  string local_2a8;
  string local_288;
  iterator local_268;
  pointer local_260;
  vector<_EXRAttribute,std::allocator<_EXRAttribute>> *local_258;
  uchar *local_250;
  int *local_248;
  _EXRAttribute local_240;
  
  if (empty_header != (bool *)0x0) {
    *empty_header = false;
  }
  if ((version->multipart == 0) || (*buf != '\0')) {
    info->display_window[2] = 0;
    info->display_window[3] = 0;
    info->screen_window_center[0] = 0.0;
    info->screen_window_center[1] = 0.0;
    info->line_order = 0;
    info->display_window[0] = 0;
    info->display_window[1] = 0;
    info->display_window[2] = 0;
    info->data_window[0] = 0;
    info->data_window[1] = 0;
    info->data_window[2] = 0;
    info->data_window[3] = 0;
    info->screen_window_width = -1.0;
    info->pixel_aspect_ratio = -1.0;
    info->tile_size_x = -1;
    info->tile_size_y = -1;
    info->tile_level_mode = -1;
    info->tile_rounding_mode = -1;
    p_Var4 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl
        .super__Vector_impl_data._M_finish != p_Var4) {
      (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = p_Var4;
    }
    local_248 = info->data_window;
    local_258 = (vector<_EXRAttribute,std::allocator<_EXRAttribute>> *)&info->attributes;
    paVar2 = &local_288.field_2;
    uVar8 = 0;
    local_2b8 = err;
    local_2b0 = version;
    local_250 = buf;
    do {
      local_288._M_string_length = 0;
      local_288.field_2._M_local_buf[0] = '\0';
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      local_2a8._M_string_length = 0;
      local_2a8.field_2._M_local_buf[0] = '\0';
      local_2c8 = (pointer)0x0;
      local_2d8 = (undefined1  [16])0x0;
      local_288._M_dataplus._M_p = (pointer)paVar2;
      puVar7 = (uchar *)ReadAttribute(&local_288,&local_2a8,
                                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_2d8,(char *)buf);
      if (puVar7 == (uchar *)0x0) {
        puVar7 = buf + 1;
        cVar12 = '\x02';
LAB_00127b3a:
LAB_00127b42:
        pfVar11 = (float *)local_2d8._0_8_;
        if ((float *)local_2d8._0_8_ != (float *)0x0) goto LAB_00127b4a;
      }
      else {
        if ((local_2b0->tiled != 0) &&
           (iVar6 = std::__cxx11::string::compare((char *)&local_288), iVar6 == 0)) {
          if (local_2d8._8_8_ != local_2d8._0_8_) {
            if (4 < (ulong)(local_2d8._8_8_ - local_2d8._0_8_)) {
              bVar3 = *(byte *)(local_2d8._0_8_ + 8);
              uVar5 = *(undefined8 *)local_2d8._0_8_;
              info->tile_size_x = (int)uVar5;
              info->tile_size_y = (int)((ulong)uVar5 >> 0x20);
              info->tile_level_mode = bVar3 & 3;
              info->tile_rounding_mode = bVar3 >> 4 & 1;
              goto LAB_00127b37;
            }
            uVar8 = 4;
          }
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar8);
          uVar10 = extraout_RDX;
LAB_00127cdf:
          uVar8 = 4;
          goto LAB_00127cf2;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_288);
        if (iVar6 == 0) {
          bVar3 = *(byte *)local_2d8._0_8_;
          if (bVar3 < 5) {
            info->compression_type = (uint)bVar3;
            goto LAB_00127b37;
          }
          if (bVar3 == 0x80) {
            pcVar9 = "ZFP compression is not supported.";
          }
          else {
            pcVar9 = "Unknown compression type.";
          }
          if (local_2b8 != (string *)0x0) {
            std::__cxx11::string::_M_replace
                      ((ulong)local_2b8,0,(char *)local_2b8->_M_string_length,(ulong)pcVar9);
            local_2dc = -7;
            goto LAB_00127bdc;
          }
          local_2dc = -7;
          cVar12 = '\x01';
          puVar7 = buf;
          goto LAB_00127b42;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_288);
        if (iVar6 == 0) {
          ReadChannelInfo((tinyexr *)info,
                          (vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *)
                          local_2d8._0_8_,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2d8._8_8_);
          cVar12 = (info->channels).
                   super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                   _M_impl.super__Vector_impl_data._M_finish ==
                   (info->channels).
                   super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((bool)cVar12) {
            local_2dc = -4;
            puVar7 = buf;
          }
          if ((bool)cVar12 && local_2b8 != (string *)0x0) {
            std::__cxx11::string::_M_replace
                      ((ulong)local_2b8,0,(char *)local_2b8->_M_string_length,0x1569b4);
            local_2dc = -4;
LAB_00127bdc:
            cVar12 = '\x01';
            puVar7 = buf;
          }
          goto LAB_00127b3a;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_288);
        if (iVar6 == 0) {
          uVar10 = local_2d8._8_8_ - local_2d8._0_8_;
          if (uVar10 == 0) goto LAB_00127cf2;
          *local_248 = *(int *)local_2d8._0_8_;
          if (uVar10 < 5) goto LAB_00127cdf;
          info->data_window[1] = *(int *)(local_2d8._0_8_ + 4);
          if (uVar10 < 9) {
LAB_00127ce6:
            uVar8 = 8;
            goto LAB_00127cf2;
          }
          info->data_window[2] = *(int *)(local_2d8._0_8_ + 8);
          if (uVar10 < 0xd) {
LAB_00127ced:
            uVar8 = 0xc;
            goto LAB_00127cf2;
          }
          info->data_window[3] = *(int *)(local_2d8._0_8_ + 0xc);
LAB_00127b37:
          cVar12 = '\0';
          goto LAB_00127b3a;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_288);
        if (iVar6 == 0) {
          uVar10 = local_2d8._8_8_ - local_2d8._0_8_;
          if (uVar10 == 0) goto LAB_00127cf2;
          info->display_window[0] = *(int *)local_2d8._0_8_;
          if (uVar10 < 5) goto LAB_00127cdf;
          info->display_window[1] = *(int *)(local_2d8._0_8_ + 4);
          if (uVar10 < 9) goto LAB_00127ce6;
          info->display_window[2] = *(int *)(local_2d8._0_8_ + 8);
          if (uVar10 < 0xd) goto LAB_00127ced;
          info->display_window[3] = *(int *)(local_2d8._0_8_ + 0xc);
          goto LAB_00127b37;
        }
        iVar6 = std::__cxx11::string::compare((char *)&local_288);
        if (iVar6 == 0) {
          info->line_order = (uint)*(byte *)local_2d8._0_8_;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)&local_288);
          if (iVar6 == 0) {
            if (local_2d8._8_8_ == local_2d8._0_8_) {
LAB_00127d03:
              do {
                uVar10 = 0;
LAB_00127cf2:
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar8,uVar10);
              } while( true );
            }
            info->pixel_aspect_ratio = *(float *)local_2d8._0_8_;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)&local_288);
            if (iVar6 == 0) {
              uVar10 = local_2d8._8_8_ - local_2d8._0_8_;
              if (uVar10 == 0) goto LAB_00127cf2;
              info->screen_window_center[0] = *(float *)local_2d8._0_8_;
              if (uVar10 < 5) goto LAB_00127cdf;
              info->screen_window_center[1] = *(float *)(local_2d8._0_8_ + 4);
              goto LAB_00127b37;
            }
            iVar6 = std::__cxx11::string::compare((char *)&local_288);
            if (iVar6 == 0) {
              if (local_2d8._8_8_ == local_2d8._0_8_) goto LAB_00127d03;
              info->screen_window_width = *(float *)local_2d8._0_8_;
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)&local_288);
              if (iVar6 != 0) {
                p_Var4 = (info->attributes).
                         super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                cVar12 = '\0';
                if ((ulong)(((long)p_Var4 -
                             (long)(info->attributes).
                                   super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4) *
                           0xf83e0f83e0f83e1) < 0x80) {
                  local_268._M_current = p_Var4;
                  strncpy(local_240.name,local_288._M_dataplus._M_p,0xff);
                  local_240.name[0xff] = '\0';
                  strncpy(local_240.type,local_2a8._M_dataplus._M_p,0xff);
                  local_240.type[0xff] = '\0';
                  local_260 = (pointer)local_2d8._0_8_;
                  uVar5 = local_2d8._8_8_;
                  local_240.size = (int)(local_2d8._8_8_ - local_2d8._0_8_);
                  local_240.value = (uchar *)malloc(local_2d8._8_8_ - local_2d8._0_8_);
                  if (uVar5 - (long)local_260 == 0) {
                    uVar8 = std::__throw_out_of_range_fmt
                                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       ,0,0);
                    if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
                      operator_delete((void *)local_2d8._0_8_,(long)local_2c8 - local_2d8._0_8_);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                      operator_delete(local_2a8._M_dataplus._M_p,
                                      CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                                               local_2a8.field_2._M_local_buf[0]) + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_288._M_dataplus._M_p != paVar2) {
                      operator_delete(local_288._M_dataplus._M_p,
                                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                               local_288.field_2._M_local_buf[0]) + 1);
                    }
                    _Unwind_Resume(uVar8);
                  }
                  memcpy(local_240.value,local_260,uVar5 - (long)local_260);
                  if (local_268._M_current ==
                      (info->attributes).
                      super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<_EXRAttribute,std::allocator<_EXRAttribute>>::
                    _M_realloc_insert<_EXRAttribute_const&>(local_258,local_268,&local_240);
                  }
                  else {
                    memcpy(local_268._M_current,&local_240,0x210);
                    pp_Var1 = &(info->attributes).
                               super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *pp_Var1 = *pp_Var1 + 1;
                  }
                }
                goto LAB_00127b3a;
              }
              if (local_2d8._8_8_ == local_2d8._0_8_) goto LAB_00127d03;
              info->chunk_count = (int)*(float *)local_2d8._0_8_;
            }
          }
        }
        cVar12 = '\0';
        pfVar11 = (float *)local_2d8._0_8_;
LAB_00127b4a:
        operator_delete(pfVar11,(long)local_2c8 - (long)pfVar11);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,
                        CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                                 local_2a8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != paVar2) {
        operator_delete(local_288._M_dataplus._M_p,
                        CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                 local_288.field_2._M_local_buf[0]) + 1);
      }
      buf = puVar7;
    } while (cVar12 == '\0');
    if (cVar12 == '\x02') {
      info->header_len = (int)puVar7 - (int)local_250;
      local_2dc = 0;
    }
  }
  else {
    local_2dc = 0;
    if (empty_header != (bool *)0x0) {
      *empty_header = true;
    }
  }
  return local_2dc;
}

Assistant:

static int ParseEXRHeader(HeaderInfo *info, bool *empty_header,
                          const EXRVersion *version, std::string *err,
                          const unsigned char *buf) {
  const char *marker = reinterpret_cast<const char *>(&buf[0]);

  if (empty_header) {
    (*empty_header) = false;
  }

  if (version->multipart) {
    if (marker[0] == '\0') {
      // End of header list.
      if (empty_header) {
        (*empty_header) = true;
      }
      return TINYEXR_SUCCESS;
    }
  }

  info->data_window[0] = 0;
  info->data_window[1] = 0;
  info->data_window[2] = 0;
  info->data_window[3] = 0;
  info->line_order = 0;  // @fixme
  info->display_window[0] = 0;
  info->display_window[1] = 0;
  info->display_window[2] = 0;
  info->display_window[3] = 0;
  info->screen_window_center[0] = 0.0f;
  info->screen_window_center[1] = 0.0f;
  info->screen_window_width = -1.0f;
  info->pixel_aspect_ratio = -1.0f;

  info->tile_size_x = -1;
  info->tile_size_y = -1;
  info->tile_level_mode = -1;
  info->tile_rounding_mode = -1;

  info->attributes.clear();

  // Read attributes
  for (;;) {
    std::string attr_name;
    std::string attr_type;
    std::vector<unsigned char> data;
    const char *marker_next =
        tinyexr::ReadAttribute(&attr_name, &attr_type, &data, marker);
    if (marker_next == NULL) {
      marker++;  // skip '\0'
      break;
    }

    if (version->tiled && attr_name.compare("tiles") == 0) {
      unsigned int x_size, y_size;
      unsigned char tile_mode;
      assert(data.size() == 9);
      memcpy(&x_size, &data.at(0), sizeof(int));
      memcpy(&y_size, &data.at(4), sizeof(int));
      tile_mode = data[8];
      tinyexr::swap4(&x_size);
      tinyexr::swap4(&y_size);

      info->tile_size_x = static_cast<int>(x_size);
      info->tile_size_y = static_cast<int>(y_size);

      // mode = levelMode + roundingMode * 16
      info->tile_level_mode = tile_mode & 0x3;
      info->tile_rounding_mode = (tile_mode >> 4) & 0x1;

    } else if (attr_name.compare("compression") == 0) {
      bool ok = false;
      if ((data[0] >= TINYEXR_COMPRESSIONTYPE_NONE) &&
          (data[0] < TINYEXR_COMPRESSIONTYPE_PIZ)) {
        ok = true;
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
        ok = true;
#else
        if (err) {
          (*err) = "PIZ compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
        ok = true;
#else
        if (err) {
          (*err) = "ZFP compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (!ok) {
        if (err) {
          (*err) = "Unknown compression type.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->compression_type = static_cast<int>(data[0]);

    } else if (attr_name.compare("channels") == 0) {
      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(info->channels, data);

      if (info->channels.size() < 1) {
        if (err) {
          (*err) = "# of channels is zero.";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

    } else if (attr_name.compare("dataWindow") == 0) {
      memcpy(&info->data_window[0], &data.at(0), sizeof(int));
      memcpy(&info->data_window[1], &data.at(4), sizeof(int));
      memcpy(&info->data_window[2], &data.at(8), sizeof(int));
      memcpy(&info->data_window[3], &data.at(12), sizeof(int));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[0]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[1]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[2]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[3]));
    } else if (attr_name.compare("displayWindow") == 0) {
      memcpy(&info->display_window[0], &data.at(0), sizeof(int));
      memcpy(&info->display_window[1], &data.at(4), sizeof(int));
      memcpy(&info->display_window[2], &data.at(8), sizeof(int));
      memcpy(&info->display_window[3], &data.at(12), sizeof(int));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[0]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[1]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[2]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->display_window[3]));
    } else if (attr_name.compare("lineOrder") == 0) {
      info->line_order = static_cast<int>(data[0]);
    } else if (attr_name.compare("pixelAspectRatio") == 0) {
      memcpy(&info->pixel_aspect_ratio, &data.at(0), sizeof(float));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->pixel_aspect_ratio));
    } else if (attr_name.compare("screenWindowCenter") == 0) {
      memcpy(&info->screen_window_center[0], &data.at(0), sizeof(float));
      memcpy(&info->screen_window_center[1], &data.at(4), sizeof(float));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->screen_window_center[0]));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->screen_window_center[1]));
    } else if (attr_name.compare("screenWindowWidth") == 0) {
      memcpy(&info->screen_window_width, &data.at(0), sizeof(float));
      tinyexr::swap4(
          reinterpret_cast<unsigned int *>(&info->screen_window_width));

    } else if (attr_name.compare("chunkCount") == 0) {
      memcpy(&info->chunk_count, &data.at(0), sizeof(int));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->chunk_count));
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (info->attributes.size() < TINYEXR_MAX_ATTRIBUTES) {
        EXRAttribute attrib;
        strncpy(attrib.name, attr_name.c_str(), 255);
        attrib.name[255] = '\0';
        strncpy(attrib.type, attr_type.c_str(), 255);
        attrib.type[255] = '\0';
        attrib.size = static_cast<int>(data.size());
        attrib.value = static_cast<unsigned char *>(malloc(data.size()));
        memcpy(reinterpret_cast<char *>(attrib.value), &data.at(0),
               data.size());
        info->attributes.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  info->header_len = static_cast<unsigned int>(
      reinterpret_cast<const unsigned char *>(marker) - buf);

  return TINYEXR_SUCCESS;
}